

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JitTransferData.cpp
# Opt level: O0

void __thiscall JitTransferData::Cleanup(JitTransferData *this)

{
  Type lpMem;
  Type lpMem_00;
  PinnedTypeRefsIDL **ppPVar1;
  PinnedTypeRefsIDL *pPVar2;
  HANDLE pVVar3;
  PinnedTypeRefsIDL *pPVar4;
  Type *ppTVar5;
  uint local_3c;
  uint i;
  CtorCacheTransferEntryIDL **entries;
  Type current;
  Type *next;
  nullptr_t local_18;
  JitTransferData *local_10;
  JitTransferData *this_local;
  
  local_18 = (nullptr_t)0x0;
  local_10 = this;
  Memory::
  WriteBarrierPtr<JsUtil::BaseHashSet<void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_void_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  ::operator=(&this->jitTimeTypeRefs,&local_18);
  if (this->lazyBailoutProperties != (Type)0x0) {
    Memory::DeleteArray<Memory::HeapAllocator,int>
              (&Memory::HeapAllocator::Instance,(long)this->lazyBailoutPropertyCount,
               this->lazyBailoutProperties);
    this->lazyBailoutProperties = (Type)0x0;
  }
  ppPVar1 = Memory::WriteBarrierPtr::operator_cast_to_PinnedTypeRefsIDL__
                      ((WriteBarrierPtr *)&this->runtimeTypeRefs);
  if (*ppPVar1 != (PinnedTypeRefsIDL *)0x0) {
    pPVar2 = Memory::WriteBarrierPtr<PinnedTypeRefsIDL>::operator->(&this->runtimeTypeRefs);
    if (pPVar2->isOOPJIT == '\0') {
      ppPVar1 = Memory::PointerValue<PinnedTypeRefsIDL>(&this->runtimeTypeRefs);
      pPVar2 = *ppPVar1;
      pPVar4 = Memory::WriteBarrierPtr<PinnedTypeRefsIDL>::operator->(&this->runtimeTypeRefs);
      Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,PinnedTypeRefsIDL>
                (&Memory::HeapAllocator::Instance,pPVar2,(ulong)pPVar4->count * 8);
    }
    else {
      ppPVar1 = Memory::WriteBarrierPtr::operator_cast_to_PinnedTypeRefsIDL__
                          ((WriteBarrierPtr *)&this->runtimeTypeRefs);
      if (*ppPVar1 != (PinnedTypeRefsIDL *)0x0) {
        pVVar3 = GetProcessHeap();
        ppPVar1 = Memory::WriteBarrierPtr::operator_cast_to_PinnedTypeRefsIDL__
                            ((WriteBarrierPtr *)&this->runtimeTypeRefs);
        HeapFree(pVVar3,0,*ppPVar1);
      }
    }
    next = (Type *)0x0;
    Memory::WriteBarrierPtr<PinnedTypeRefsIDL>::operator=(&this->runtimeTypeRefs,&next);
  }
  if (this->propertyGuardsByPropertyId != (Type)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::TypeGuardTransferEntry>
              (&Memory::HeapAllocator::Instance,this->propertyGuardsByPropertyId,
               this->propertyGuardsByPropertyIdPlusSize);
    this->propertyGuardsByPropertyId = (Type)0x0;
  }
  this->propertyGuardCount = 0;
  this->propertyGuardsByPropertyIdPlusSize = 0;
  if (this->ctorCacheGuardsByPropertyId != (Type)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::CtorCacheGuardTransferEntry>
              (&Memory::HeapAllocator::Instance,this->ctorCacheGuardsByPropertyId,
               this->ctorCacheGuardsByPropertyIdPlusSize);
    this->ctorCacheGuardsByPropertyId = (Type)0x0;
  }
  this->ctorCacheGuardsByPropertyIdPlusSize = 0;
  if (this->equivalentTypeGuards != (Type)0x0) {
    Memory::DeleteArray<Memory::HeapAllocator,Js::JitEquivalentTypeGuard*>
              (&Memory::HeapAllocator::Instance,(long)this->equivalentTypeGuardCount,
               this->equivalentTypeGuards);
    this->equivalentTypeGuards = (Type)0x0;
  }
  this->equivalentTypeGuardCount = 0;
  if (this->jitTransferRawData != (Type)0x0) {
    Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,NativeCodeData>
              (&Memory::HeapAllocator::Instance,this->jitTransferRawData);
    this->jitTransferRawData = (Type)0x0;
  }
  if ((this->equivalentTypeGuardOffsets != (Type)0x0) &&
     (this->equivalentTypeGuardOffsets != (Type)0x0)) {
    pVVar3 = GetProcessHeap();
    HeapFree(pVVar3,0,this->equivalentTypeGuardOffsets);
  }
  if ((this->typeGuardTransferData).entries != (Type)0x0) {
    ppTVar5 = &(this->typeGuardTransferData).entries;
    while (*ppTVar5 != (Type)0x0) {
      lpMem = *ppTVar5;
      *ppTVar5 = (*ppTVar5)->next;
      if (lpMem != (Type)0x0) {
        pVVar3 = GetProcessHeap();
        HeapFree(pVVar3,0,lpMem);
      }
    }
  }
  if ((this->ctorCacheTransferData).entries != (Type)0x0) {
    lpMem_00 = (this->ctorCacheTransferData).entries;
    for (local_3c = 0; local_3c < (this->ctorCacheTransferData).ctorCachesCount;
        local_3c = local_3c + 1) {
      if (lpMem_00[local_3c] != (CtorCacheTransferEntryIDL *)0x0) {
        pVVar3 = GetProcessHeap();
        HeapFree(pVVar3,0,lpMem_00[local_3c]);
      }
    }
    if (lpMem_00 != (Type)0x0) {
      pVVar3 = GetProcessHeap();
      HeapFree(pVVar3,0,lpMem_00);
    }
  }
  return;
}

Assistant:

void JitTransferData::Cleanup()
{
    // This dictionary is recycler allocated so it doesn't need to be explicitly freed.
    this->jitTimeTypeRefs = nullptr;

    if (this->lazyBailoutProperties != nullptr)
    {
        HeapDeleteArray(this->lazyBailoutPropertyCount, this->lazyBailoutProperties);
        this->lazyBailoutProperties = nullptr;
    }

    // All structures below are heap allocated and need to be freed explicitly.
    if (this->runtimeTypeRefs != nullptr)
    {
        if (this->runtimeTypeRefs->isOOPJIT)
        {
            midl_user_free(this->runtimeTypeRefs);
        }
        else
        {
            HeapDeletePlus(offsetof(PinnedTypeRefsIDL, typeRefs) + sizeof(void*)*this->runtimeTypeRefs->count - sizeof(PinnedTypeRefsIDL),
                PointerValue(this->runtimeTypeRefs));
        }
        this->runtimeTypeRefs = nullptr;
    }

    if (this->propertyGuardsByPropertyId != nullptr)
    {
        HeapDeletePlus(this->propertyGuardsByPropertyIdPlusSize, this->propertyGuardsByPropertyId);
        this->propertyGuardsByPropertyId = nullptr;
    }
    this->propertyGuardCount = 0;
    this->propertyGuardsByPropertyIdPlusSize = 0;

    if (this->ctorCacheGuardsByPropertyId != nullptr)
    {
        HeapDeletePlus(this->ctorCacheGuardsByPropertyIdPlusSize, this->ctorCacheGuardsByPropertyId);
        this->ctorCacheGuardsByPropertyId = nullptr;
    }
    this->ctorCacheGuardsByPropertyIdPlusSize = 0;

    if (this->equivalentTypeGuards != nullptr)
    {
        HeapDeleteArray(this->equivalentTypeGuardCount, this->equivalentTypeGuards);
        this->equivalentTypeGuards = nullptr;
    }
    this->equivalentTypeGuardCount = 0;

    if (this->jitTransferRawData != nullptr)
    {
        HeapDelete(this->jitTransferRawData);
        this->jitTransferRawData = nullptr;
    }

    if (this->equivalentTypeGuardOffsets)
    {
        midl_user_free(this->equivalentTypeGuardOffsets);
    }

    if (this->typeGuardTransferData.entries != nullptr)
    {
        auto next = &this->typeGuardTransferData.entries;
        while (*next)
        {
            auto current = (*next);
            *next = (*next)->next;
            midl_user_free(current);
        }
    }

    if (this->ctorCacheTransferData.entries != nullptr)
    {
        CtorCacheTransferEntryIDL ** entries = this->ctorCacheTransferData.entries;
        for (uint i = 0; i < this->ctorCacheTransferData.ctorCachesCount; ++i)
        {
            midl_user_free(entries[i]);
        }
        midl_user_free(entries);
    }
}